

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent_coop.cpp
# Opt level: O1

void __thiscall
so_5::coop_t::do_add_agent
          (coop_t *this,agent_ref_t *agent_ref,disp_binder_unique_ptr_t *disp_binder)

{
  atomic_refcounted_t *paVar1;
  exception_t *this_00;
  disp_binder_ref_t dbinder;
  undefined1 local_50 [32];
  disp_binder_t *local_30;
  _Alloc_hider local_28;
  
  local_30 = (disp_binder->_M_t).
             super___uniq_ptr_impl<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>_>.
             _M_t.
             super__Tuple_impl<0UL,_so_5::disp_binder_t_*,_std::default_delete<so_5::disp_binder_t>_>
             .super__Head_base<0UL,_so_5::disp_binder_t_*,_false>._M_head_impl;
  (disp_binder->_M_t).
  super___uniq_ptr_impl<so_5::disp_binder_t,_std::default_delete<so_5::disp_binder_t>_>._M_t.
  super__Tuple_impl<0UL,_so_5::disp_binder_t_*,_std::default_delete<so_5::disp_binder_t>_>.
  super__Head_base<0UL,_so_5::disp_binder_t_*,_false>._M_head_impl = (disp_binder_t *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<so_5::disp_binder_t*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_28,local_30);
  if ((local_30 != (disp_binder_t *)0x0) &&
     (local_50._0_8_ = agent_ref->m_obj, (agent_t *)local_50._0_8_ != (agent_t *)0x0)) {
    LOCK();
    (((agent_t *)local_50._0_8_)->super_atomic_refcounted_t).m_ref_counter.
    super___atomic_base<unsigned_long>._M_i =
         (((agent_t *)local_50._0_8_)->super_atomic_refcounted_t).m_ref_counter.
         super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
    local_50._8_8_ = local_30;
    local_50._16_8_ = local_28._M_p;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)(local_28._M_p + 8) = *(int *)(local_28._M_p + 8) + 1;
        UNLOCK();
      }
      else {
        *(int *)(local_28._M_p + 8) = *(int *)(local_28._M_p + 8) + 1;
      }
    }
    std::
    vector<so_5::coop_t::agent_with_disp_binder_t,_std::allocator<so_5::coop_t::agent_with_disp_binder_t>_>
    ::emplace_back<so_5::coop_t::agent_with_disp_binder_t>
              (&this->m_agent_array,(agent_with_disp_binder_t *)local_50);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._16_8_);
    }
    if ((agent_t *)local_50._0_8_ != (agent_t *)0x0) {
      LOCK();
      paVar1 = (atomic_refcounted_t *)(local_50._0_8_ + 8);
      (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i =
           (paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i - 1;
      UNLOCK();
      if (((paVar1->m_ref_counter).super___atomic_base<unsigned_long>._M_i == 0) &&
         ((agent_t *)local_50._0_8_ != (agent_t *)0x0)) {
        (**(code **)(*(long *)local_50._0_8_ + 8))();
      }
      local_50._0_8_ = (agent_t *)0x0;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_28._M_p);
    }
    return;
  }
  this_00 = (exception_t *)__cxa_allocate_exception(0x18);
  local_50._0_8_ = local_50 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"zero ptr to agent or disp binder","");
  exception_t::exception_t(this_00,(string *)local_50,0x16);
  __cxa_throw(this_00,&exception_t::typeinfo,exception_t::~exception_t);
}

Assistant:

void
coop_t::do_add_agent(
	const agent_ref_t & agent_ref,
	disp_binder_unique_ptr_t disp_binder )
{
	disp_binder_ref_t dbinder( disp_binder.release() );

	if( nullptr == dbinder.get() || nullptr == agent_ref.get() )
		throw exception_t(
			"zero ptr to agent or disp binder",
			rc_coop_has_references_to_null_agents_or_binders );

	m_agent_array.push_back(
		agent_with_disp_binder_t( agent_ref, dbinder ) );
}